

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_query_square_flag(command *cmd)

{
  undefined1 uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  ulong in_RAX;
  wchar_t flag;
  char c;
  undefined8 local_18;
  
  local_18 = in_RAX & 0xffffffff00000000;
  wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)&local_18);
  if (wVar3 != L'\0') {
    _Var2 = get_com("Debug Command Query [grasvwdftniolx]: ",(char *)((long)&local_18 + 7));
    if (!_Var2) {
      return;
    }
    uVar1 = local_18._7_1_;
    switch(uVar1) {
    case 0x61:
      local_18 = CONCAT44(local_18._4_4_,3);
      break;
    case 100:
      local_18 = CONCAT44(local_18._4_4_,0x13);
      break;
    case 0x66:
      local_18 = CONCAT44(local_18._4_4_,8);
      break;
    case 0x67:
      local_18 = CONCAT44(local_18._4_4_,2);
      break;
    case 0x69:
      local_18 = CONCAT44(local_18._4_4_,0xb);
      break;
    case 0x6c:
      local_18 = CONCAT44(local_18._4_4_,0xd);
      break;
    case 0x6e:
      local_18 = CONCAT44(local_18._4_4_,10);
      break;
    case 0x6f:
      local_18 = CONCAT44(local_18._4_4_,0xc);
      break;
    case 0x72:
      local_18 = CONCAT44(local_18._4_4_,4);
      break;
    case 0x73:
      local_18 = CONCAT44(local_18._4_4_,5);
      break;
    case 0x74:
      local_18 = CONCAT44(local_18._4_4_,9);
      break;
    case 0x76:
      local_18 = CONCAT44(local_18._4_4_,6);
      break;
    case 0x77:
      local_18 = CONCAT44(local_18._4_4_,7);
      break;
    case 0x78:
      local_18 = CONCAT44(local_18._4_4_,0xe);
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",(wchar_t)local_18);
    if (!_Var2) {
      return;
    }
  }
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_square_flag,&local_18);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_square_flag(struct command *cmd)
{
	int flag = 0;

	if (cmd_get_arg_choice(cmd, "choice", &flag) != CMD_OK) {
		char c;

		if (!get_com("Debug Command Query [grasvwdftniolx]: ", &c))
			return;
		switch (c) {
			case 'g': flag = SQUARE_GLOW; break;
			case 'r': flag = SQUARE_ROOM; break;
			case 'a': flag = SQUARE_VAULT; break;
			case 's': flag = SQUARE_SEEN; break;
			case 'v': flag = SQUARE_VIEW; break;
			case 'w': flag = SQUARE_WASSEEN; break;
			case 'd': flag = SQUARE_DTRAP; break;
			case 'f': flag = SQUARE_FEEL; break;
			case 't': flag = SQUARE_TRAP; break;
			case 'n': flag = SQUARE_INVIS; break;
			case 'i': flag = SQUARE_WALL_INNER; break;
			case 'o': flag = SQUARE_WALL_OUTER; break;
			case 'l': flag = SQUARE_WALL_SOLID; break;
			case 'x': flag = SQUARE_MON_RESTRICT; break;
		}
		cmd_set_arg_choice(cmd, "choice", flag);
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_square_flag, &flag);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}